

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authprogs_test_driver.c
# Opt level: O3

int main(int ac,char **av)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  clock_t cVar5;
  clock_t cVar6;
  functionMapEntry *pfVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  int testNum;
  uint local_44;
  char **local_40;
  uint local_34;
  
  local_44 = 0;
  uVar11 = 0xffffffff;
  if (ac < 2) {
    puts("Available tests:");
    pfVar7 = cmakeGeneratedFunctionMapEntries;
    uVar9 = 0;
    do {
      printf("%3d. %s\n",uVar9 & 0xffffffff,pfVar7->name);
      uVar9 = uVar9 + 1;
      pfVar7 = pfVar7 + 1;
    } while (uVar9 != 3);
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&local_44);
    if (iVar1 != 1) {
      pcVar8 = "Couldn\'t parse that input as a number";
      goto LAB_0010239b;
    }
    if (2 < (int)local_44) {
      pcVar8 = "%3d is an invalid test number.\n";
      goto LAB_0010250e;
    }
    ac = ac - 1;
    av = av + 1;
    uVar11 = local_44;
  }
  if (ac < 2 || uVar11 != 0xffffffff) {
    if (uVar11 == 0xffffffff) {
      bVar13 = false;
      local_34 = 0;
      goto LAB_0010242f;
    }
  }
  else {
    pcVar8 = av[1];
    bVar13 = false;
    local_34 = 0;
    if (*pcVar8 == '-') {
      local_34 = 0;
      bVar13 = false;
      if (pcVar8[1] == 'R') {
        bVar13 = pcVar8[2] == '\0';
        if (bVar13 && (uint)ac < 3) {
          pcVar8 = "-R needs an additional parameter.";
LAB_0010239b:
          puts(pcVar8);
          return -1;
        }
        local_34 = (uint)(pcVar8[2] == '\0');
      }
      if ((pcVar8[1] == 'A') && (pcVar8[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",3);
        lVar10 = 0;
        do {
          pcVar8 = cmakeGeneratedFunctionMapEntries[lVar10].name;
          if (2 < (uint)ac) {
            uVar9 = 0;
            do {
              iVar1 = strcmp(pcVar8,av[uVar9 + 2]);
              if (iVar1 == 0) {
                printf("ok %d %s # SKIP\n",lVar10 + 1U & 0xffffffff,pcVar8);
                goto LAB_00102688;
              }
              uVar9 = uVar9 + 1;
            } while (ac - 2 != uVar9);
          }
          cVar5 = clock();
          iVar1 = (*cmakeGeneratedFunctionMapEntries[lVar10].func)(ac,av);
          cVar6 = clock();
          pcVar3 = "ok";
          if (iVar1 == -1) {
            pcVar3 = "not ok";
          }
          printf("%s %d %s # %f\n",(double)(cVar6 - cVar5) / 1000000.0,pcVar3,
                 lVar10 + 1U & 0xffffffff,pcVar8);
LAB_00102688:
          lVar10 = lVar10 + 1;
          if (lVar10 == 3) {
            puts("All tests finished.");
            return 0;
          }
        } while( true );
      }
    }
LAB_0010242f:
    local_40 = av;
    pcVar8 = lowercase(av[(ulong)local_34 + 1]);
    pfVar7 = cmakeGeneratedFunctionMapEntries;
    uVar9 = 0;
    do {
      pcVar3 = lowercase(pfVar7->name);
      if ((bVar13) && (pcVar4 = strstr(pcVar3,pcVar8), pcVar4 != (char *)0x0)) {
        ac = ac - 2;
        local_40 = local_40 + 2;
LAB_001024b3:
        uVar11 = (uint)uVar9;
      }
      else {
        uVar11 = 0xffffffff;
        if ((local_34 == 0) && (iVar1 = strcmp(pcVar3,pcVar8), iVar1 == 0)) {
          ac = ac - 1;
          local_40 = local_40 + 1;
          goto LAB_001024b3;
        }
      }
      free(pcVar3);
      if (uVar11 != 0xffffffff) break;
      pfVar7 = pfVar7 + 1;
      bVar12 = uVar9 < 2;
      uVar9 = uVar9 + 1;
    } while (bVar12);
    free(pcVar8);
    av = local_40;
    if (uVar11 == 0xffffffff) {
      puts("Available tests:");
      pfVar7 = cmakeGeneratedFunctionMapEntries;
      uVar9 = 0;
      do {
        printf("%3d. %s\n",uVar9 & 0xffffffff,pfVar7->name);
        uVar9 = uVar9 + 1;
        pfVar7 = pfVar7 + 1;
      } while (uVar9 != 3);
      printf("Failed: %s is an invalid test name.\n",local_40[1]);
      return -1;
    }
  }
  iVar1 = test_framework_init(ac,av);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (uVar11 < 3) {
    iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar11].func)(ac,av);
    iVar2 = test_framework_uninit(ac,av,iVar1);
    if (iVar2 == 0) {
      return iVar1;
    }
    return iVar2;
  }
  pcVar8 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_0010250e:
  printf(pcVar8,(ulong)local_44);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;
int rc = test_framework_init(ac, av); if (rc != TEST_NO_ERROR) return rc;
    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);
rc = test_framework_uninit(ac, av, result); if (rc != TEST_NO_ERROR) return rc;
    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}